

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureBaseGL.cpp
# Opt level: O0

void __thiscall Diligent::TextureBaseGL::SetDefaultGLParameters(TextureBaseGL *this)

{
  GLenum GVar1;
  GLuint GVar2;
  Char *pCVar3;
  undefined1 local_218 [8];
  string msg_12;
  undefined1 local_1f0 [4];
  GLenum err_10;
  string msg_11;
  undefined1 local_1c8 [4];
  GLenum err_9;
  string msg_10;
  undefined1 local_1a0 [4];
  GLenum err_8;
  string msg_9;
  undefined1 local_178 [4];
  GLenum err_7;
  string msg_8;
  undefined1 local_150 [4];
  GLenum err_6;
  string msg_7;
  undefined1 local_128 [4];
  GLenum err_5;
  string msg_6;
  undefined1 local_100 [4];
  GLenum err_4;
  string msg_5;
  undefined1 local_d8 [4];
  GLenum err_3;
  string msg_4;
  undefined1 local_b0 [4];
  GLenum err_2;
  string msg_3;
  undefined1 local_88 [4];
  GLenum err_1;
  string msg_2;
  string msg_1;
  GLenum err;
  undefined1 local_38 [8];
  string msg;
  GLint TextureBinding;
  GLint BoundTex;
  TextureBaseGL *this_local;
  
  msg.field_2._8_4_ = 0;
  GVar1 = this->m_BindTarget;
  if (GVar1 == 0xde0) {
    msg.field_2._8_4_ = 0x8068;
  }
  else if (GVar1 == 0xde1) {
    msg.field_2._8_4_ = 0x8069;
  }
  else if (GVar1 == 0x806f) {
    msg.field_2._8_4_ = 0x806a;
  }
  else if (GVar1 == 0x8513) {
    msg.field_2._8_4_ = 0x8514;
  }
  else if (GVar1 == 0x8c18) {
    msg.field_2._8_4_ = 0x8c1c;
  }
  else if (GVar1 == 0x8c1a) {
    msg.field_2._8_4_ = 0x8c1d;
  }
  else if (GVar1 == 0x9009) {
    msg.field_2._8_4_ = 0x900a;
  }
  else if (GVar1 == 0x9100) {
    msg.field_2._8_4_ = 0x9104;
  }
  else if (GVar1 == 0x9102) {
    msg.field_2._8_4_ = 0x9105;
  }
  else {
    FormatString<char[20]>((string *)local_38,(char (*) [20])"Unknown bind target");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"SetDefaultGLParameters",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
               ,0x31a);
    std::__cxx11::string::~string((string *)local_38);
  }
  glGetIntegerv(msg.field_2._8_4_,(undefined1 *)((long)&msg.field_2 + 0xc));
  msg_1.field_2._8_4_ = glGetError();
  if (msg_1.field_2._8_4_ != 0) {
    LogError<false,char[54],char[17],unsigned_int>
              (false,"SetDefaultGLParameters",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
               ,0x31e,(char (*) [54])"Failed to set GL_TEXTURE_MIN_FILTER texture parameter",
               (char (*) [17])"\nGL Error Code: ",(uint *)(msg_1.field_2._M_local_buf + 8));
    FormatString<char[6]>((string *)((long)&msg_2.field_2 + 8),(char (*) [6])0x4585f6);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"SetDefaultGLParameters",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
               ,0x31e);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  GVar2 = GLObjectWrappers::GLObjWrapper::operator_cast_to_unsigned_int
                    ((GLObjWrapper *)&this->m_GlTexture);
  if (msg.field_2._12_4_ != GVar2) {
    FormatString<char[43]>
              ((string *)local_88,(char (*) [43])"Current texture is not bound to GL context");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"SetDefaultGLParameters",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
               ,799);
    std::__cxx11::string::~string((string *)local_88);
  }
  if ((this->super_TextureBase<Diligent::EngineGLImplTraits>).
      super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
      .m_Desc.Format == TEX_FORMAT_A8_UNORM) {
    glTexParameteri(this->m_BindTarget,0x8e42,0);
    msg_3.field_2._12_4_ = glGetError();
    if (msg_3.field_2._12_4_ != 0) {
      LogError<false,char[53],char[17],unsigned_int>
                (false,"SetDefaultGLParameters",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x328,(char (*) [53])"Failed to set GL_TEXTURE_SWIZZLE_R texture parameter",
                 (char (*) [17])"\nGL Error Code: ",(uint *)(msg_3.field_2._M_local_buf + 0xc));
      FormatString<char[6]>((string *)local_b0,(char (*) [6])0x4585f6);
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"SetDefaultGLParameters",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x328);
      std::__cxx11::string::~string((string *)local_b0);
    }
    glTexParameteri(this->m_BindTarget,0x8e43,0);
    msg_4.field_2._12_4_ = glGetError();
    if (msg_4.field_2._12_4_ != 0) {
      LogError<false,char[53],char[17],unsigned_int>
                (false,"SetDefaultGLParameters",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x32a,(char (*) [53])"Failed to set GL_TEXTURE_SWIZZLE_G texture parameter",
                 (char (*) [17])"\nGL Error Code: ",(uint *)(msg_4.field_2._M_local_buf + 0xc));
      FormatString<char[6]>((string *)local_d8,(char (*) [6])0x4585f6);
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"SetDefaultGLParameters",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x32a);
      std::__cxx11::string::~string((string *)local_d8);
    }
    glTexParameteri(this->m_BindTarget,0x8e44,0);
    msg_5.field_2._12_4_ = glGetError();
    if (msg_5.field_2._12_4_ != 0) {
      LogError<false,char[53],char[17],unsigned_int>
                (false,"SetDefaultGLParameters",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x32c,(char (*) [53])"Failed to set GL_TEXTURE_SWIZZLE_B texture parameter",
                 (char (*) [17])"\nGL Error Code: ",(uint *)(msg_5.field_2._M_local_buf + 0xc));
      FormatString<char[6]>((string *)local_100,(char (*) [6])0x4585f6);
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"SetDefaultGLParameters",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x32c);
      std::__cxx11::string::~string((string *)local_100);
    }
    glTexParameteri(this->m_BindTarget,0x8e45,0x1903);
    msg_6.field_2._12_4_ = glGetError();
    if (msg_6.field_2._12_4_ != 0) {
      LogError<false,char[53],char[17],unsigned_int>
                (false,"SetDefaultGLParameters",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x32e,(char (*) [53])"Failed to set GL_TEXTURE_SWIZZLE_A texture parameter",
                 (char (*) [17])"\nGL Error Code: ",(uint *)(msg_6.field_2._M_local_buf + 0xc));
      FormatString<char[6]>((string *)local_128,(char (*) [6])0x4585f6);
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"SetDefaultGLParameters",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x32e);
      std::__cxx11::string::~string((string *)local_128);
    }
  }
  else if ((this->super_TextureBase<Diligent::EngineGLImplTraits>).
           super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
           .m_Desc.Format == TEX_FORMAT_BGRA8_UNORM) {
    glTexParameteri(this->m_BindTarget,0x8e42,0x1905);
    msg_7.field_2._12_4_ = glGetError();
    if (msg_7.field_2._12_4_ != 0) {
      LogError<false,char[53],char[17],unsigned_int>
                (false,"SetDefaultGLParameters",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x335,(char (*) [53])"Failed to set GL_TEXTURE_SWIZZLE_R texture parameter",
                 (char (*) [17])"\nGL Error Code: ",(uint *)(msg_7.field_2._M_local_buf + 0xc));
      FormatString<char[6]>((string *)local_150,(char (*) [6])0x4585f6);
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"SetDefaultGLParameters",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x335);
      std::__cxx11::string::~string((string *)local_150);
    }
    glTexParameteri(this->m_BindTarget,0x8e43,0x1904);
    msg_8.field_2._12_4_ = glGetError();
    if (msg_8.field_2._12_4_ != 0) {
      LogError<false,char[53],char[17],unsigned_int>
                (false,"SetDefaultGLParameters",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x337,(char (*) [53])"Failed to set GL_TEXTURE_SWIZZLE_G texture parameter",
                 (char (*) [17])"\nGL Error Code: ",(uint *)(msg_8.field_2._M_local_buf + 0xc));
      FormatString<char[6]>((string *)local_178,(char (*) [6])0x4585f6);
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"SetDefaultGLParameters",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x337);
      std::__cxx11::string::~string((string *)local_178);
    }
    glTexParameteri(this->m_BindTarget,0x8e44,0x1903);
    msg_9.field_2._12_4_ = glGetError();
    if (msg_9.field_2._12_4_ != 0) {
      LogError<false,char[53],char[17],unsigned_int>
                (false,"SetDefaultGLParameters",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x339,(char (*) [53])"Failed to set GL_TEXTURE_SWIZZLE_B texture parameter",
                 (char (*) [17])"\nGL Error Code: ",(uint *)(msg_9.field_2._M_local_buf + 0xc));
      FormatString<char[6]>((string *)local_1a0,(char (*) [6])0x4585f6);
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"SetDefaultGLParameters",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x339);
      std::__cxx11::string::~string((string *)local_1a0);
    }
    glTexParameteri(this->m_BindTarget,0x8e45,0x1906);
    msg_10.field_2._12_4_ = glGetError();
    if (msg_10.field_2._12_4_ != 0) {
      LogError<false,char[53],char[17],unsigned_int>
                (false,"SetDefaultGLParameters",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x33b,(char (*) [53])"Failed to set GL_TEXTURE_SWIZZLE_A texture parameter",
                 (char (*) [17])"\nGL Error Code: ",(uint *)(msg_10.field_2._M_local_buf + 0xc));
      FormatString<char[6]>((string *)local_1c8,(char (*) [6])0x4585f6);
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"SetDefaultGLParameters",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x33b);
      std::__cxx11::string::~string((string *)local_1c8);
    }
  }
  if ((this->m_BindTarget != 0x9100) && (this->m_BindTarget != 0x9102)) {
    glTexParameteri(this->m_BindTarget,0x2801,0x2600);
    msg_11.field_2._12_4_ = glGetError();
    if (msg_11.field_2._12_4_ != 0) {
      LogError<false,char[54],char[17],unsigned_int>
                (false,"SetDefaultGLParameters",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x349,(char (*) [54])"Failed to set GL_TEXTURE_MIN_FILTER texture parameter",
                 (char (*) [17])"\nGL Error Code: ",(uint *)(msg_11.field_2._M_local_buf + 0xc));
      FormatString<char[6]>((string *)local_1f0,(char (*) [6])0x4585f6);
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"SetDefaultGLParameters",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x349);
      std::__cxx11::string::~string((string *)local_1f0);
    }
    glTexParameteri(this->m_BindTarget,0x2800,0x2600);
    msg_12.field_2._12_4_ = glGetError();
    if (msg_12.field_2._12_4_ != 0) {
      LogError<false,char[54],char[17],unsigned_int>
                (false,"SetDefaultGLParameters",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x34d,(char (*) [54])"Failed to set GL_TEXTURE_MAG_FILTER texture parameter",
                 (char (*) [17])"\nGL Error Code: ",(uint *)(msg_12.field_2._M_local_buf + 0xc));
      FormatString<char[6]>((string *)local_218,(char (*) [6])0x4585f6);
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"SetDefaultGLParameters",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x34d);
      std::__cxx11::string::~string((string *)local_218);
    }
  }
  return;
}

Assistant:

void TextureBaseGL::SetDefaultGLParameters()
{
#ifdef DILIGENT_DEBUG
    {
        GLint BoundTex;
        GLint TextureBinding = 0;
        switch (m_BindTarget)
        {
                // clang-format off
            case GL_TEXTURE_1D:                     TextureBinding = GL_TEXTURE_BINDING_1D;                   break;
            case GL_TEXTURE_1D_ARRAY:               TextureBinding = GL_TEXTURE_BINDING_1D_ARRAY;             break;
            case GL_TEXTURE_2D:                     TextureBinding = GL_TEXTURE_BINDING_2D;                   break;
            case GL_TEXTURE_2D_ARRAY:               TextureBinding = GL_TEXTURE_BINDING_2D_ARRAY;             break;
            case GL_TEXTURE_2D_MULTISAMPLE:         TextureBinding = GL_TEXTURE_BINDING_2D_MULTISAMPLE;       break;
            case GL_TEXTURE_2D_MULTISAMPLE_ARRAY:   TextureBinding = GL_TEXTURE_BINDING_2D_MULTISAMPLE_ARRAY; break;
            case GL_TEXTURE_3D:                     TextureBinding = GL_TEXTURE_BINDING_3D;                   break;
            case GL_TEXTURE_CUBE_MAP:               TextureBinding = GL_TEXTURE_BINDING_CUBE_MAP;             break;
            case GL_TEXTURE_CUBE_MAP_ARRAY:         TextureBinding = GL_TEXTURE_BINDING_CUBE_MAP_ARRAY;       break;
            default: UNEXPECTED("Unknown bind target");
                // clang-format on
        }
        glGetIntegerv(TextureBinding, &BoundTex);
        DEV_CHECK_GL_ERROR("Failed to set GL_TEXTURE_MIN_FILTER texture parameter");
        VERIFY(static_cast<GLuint>(BoundTex) == m_GlTexture, "Current texture is not bound to GL context");
    }
#endif

    if (m_Desc.Format == TEX_FORMAT_A8_UNORM)
    {
        // We need to do channel swizzling since TEX_FORMAT_A8_UNORM
        // is actually implemented using GL_RED
        glTexParameteri(m_BindTarget, GL_TEXTURE_SWIZZLE_R, GL_ZERO);
        DEV_CHECK_GL_ERROR("Failed to set GL_TEXTURE_SWIZZLE_R texture parameter");
        glTexParameteri(m_BindTarget, GL_TEXTURE_SWIZZLE_G, GL_ZERO);
        DEV_CHECK_GL_ERROR("Failed to set GL_TEXTURE_SWIZZLE_G texture parameter");
        glTexParameteri(m_BindTarget, GL_TEXTURE_SWIZZLE_B, GL_ZERO);
        DEV_CHECK_GL_ERROR("Failed to set GL_TEXTURE_SWIZZLE_B texture parameter");
        glTexParameteri(m_BindTarget, GL_TEXTURE_SWIZZLE_A, GL_RED);
        DEV_CHECK_GL_ERROR("Failed to set GL_TEXTURE_SWIZZLE_A texture parameter");
    }
    else if (m_Desc.Format == TEX_FORMAT_BGRA8_UNORM)
    {
        // We need to do channel swizzling since TEX_FORMAT_BGRA8_UNORM
        // is actually implemented using GL_RGBA
        glTexParameteri(m_BindTarget, GL_TEXTURE_SWIZZLE_R, GL_BLUE);
        DEV_CHECK_GL_ERROR("Failed to set GL_TEXTURE_SWIZZLE_R texture parameter");
        glTexParameteri(m_BindTarget, GL_TEXTURE_SWIZZLE_G, GL_GREEN);
        DEV_CHECK_GL_ERROR("Failed to set GL_TEXTURE_SWIZZLE_G texture parameter");
        glTexParameteri(m_BindTarget, GL_TEXTURE_SWIZZLE_B, GL_RED);
        DEV_CHECK_GL_ERROR("Failed to set GL_TEXTURE_SWIZZLE_B texture parameter");
        glTexParameteri(m_BindTarget, GL_TEXTURE_SWIZZLE_A, GL_ALPHA);
        DEV_CHECK_GL_ERROR("Failed to set GL_TEXTURE_SWIZZLE_A texture parameter");
    }

    if (m_BindTarget != GL_TEXTURE_2D_MULTISAMPLE &&
        m_BindTarget != GL_TEXTURE_2D_MULTISAMPLE_ARRAY)
    {
        // Note that texture bound to image unit must be complete.
        // That means that if an integer texture is being bound, its
        // GL_TEXTURE_MIN_FILTER and GL_TEXTURE_MAG_FILTER must be NEAREST,
        // otherwise it will be incomplete

        // The default value of GL_TEXTURE_MIN_FILTER is GL_NEAREST_MIPMAP_LINEAR
        // Reset it to GL_NEAREST to avoid incompleteness issues with integer textures
        glTexParameteri(m_BindTarget, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
        DEV_CHECK_GL_ERROR("Failed to set GL_TEXTURE_MIN_FILTER texture parameter");

        // The default value of GL_TEXTURE_MAG_FILTER is GL_LINEAR
        glTexParameteri(m_BindTarget, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
        DEV_CHECK_GL_ERROR("Failed to set GL_TEXTURE_MAG_FILTER texture parameter");
    }
}